

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O1

PmError alsa_write_short(PmInternal *midi,PmEvent *event)

{
  void *pvVar1;
  uint uVar2;
  PmError PVar3;
  undefined1 *puVar4;
  uint uVar5;
  int iVar6;
  
  uVar5 = event->message;
  uVar2 = uVar5 & 0xff;
  iVar6 = 0;
  if (0x7f < uVar2) {
    if (uVar2 < 0xf0) {
      uVar2 = uVar2 - 0x80 >> 4;
      puVar4 = midi_message_length_length;
    }
    else {
      uVar2 = uVar2 - 0xf0;
      puVar4 = midi_message_length_length_7;
    }
    iVar6 = *(int *)(puVar4 + (ulong)uVar2 * 4);
  }
  pvVar1 = midi->descriptor;
  if (pvVar1 == (void *)0x0) {
    PVar3 = pmBadPtr;
  }
  else {
    if (0 < iVar6) {
      do {
        alsa_write_byte(midi,(uchar)uVar5,event->timestamp);
        if (*(int *)((long)pvVar1 + 0x18) < 0) break;
        uVar5 = (int)uVar5 >> 8;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    if (*(int *)((long)pvVar1 + 0x18) < 0) {
      PVar3 = pmHostError;
    }
    else {
      *(undefined4 *)((long)pvVar1 + 0x18) = 0;
      PVar3 = pmNoData;
    }
  }
  return PVar3;
}

Assistant:

static PmError alsa_write_short(PmInternal *midi, PmEvent *event)
{
    int bytes = midi_message_length(event->message);
    PmMessage msg = event->message;
    int i;
    alsa_descriptor_type desc = (alsa_descriptor_type) midi->descriptor;
    if (!desc) return pmBadPtr;
    for (i = 0; i < bytes; i++) {
        unsigned char byte = msg;
        VERBOSE printf("sending 0x%x\n", byte);
        alsa_write_byte(midi, byte, event->timestamp);
        if (desc->error < 0) break;
        msg >>= 8; /* shift next byte into position */
    }
    if (desc->error < 0) return pmHostError;
    desc->error = pmNoError;
    return pmNoError;
}